

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator<QHashPrivate::Node<QByteArray,_int>_> __thiscall
QHashPrivate::iterator<QHashPrivate::Node<QByteArray,_int>_>::operator++
          (iterator<QHashPrivate::Node<QByteArray,_int>_> *this)

{
  long lVar1;
  bool bVar2;
  iterator<QHashPrivate::Node<QByteArray,_int>_> *in_RDI;
  long in_FS_OFFSET;
  iterator<QHashPrivate::Node<QByteArray,_int>_> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  do {
    in_RDI->bucket = in_RDI->bucket + 1;
    if (in_RDI->bucket == in_RDI->d->numBuckets) {
      in_RDI->d = (Data<QHashPrivate::Node<QByteArray,_int>_> *)0x0;
      in_RDI->bucket = 0;
      break;
    }
    bVar2 = isUnused(this_00);
  } while (bVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return *in_RDI;
}

Assistant:

iterator operator++() noexcept
    {
        while (true) {
            ++bucket;
            if (bucket == d->numBuckets) {
                d = nullptr;
                bucket = 0;
                break;
            }
            if (!isUnused())
                break;
        }
        return *this;
    }